

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::BeginColumns(char *str_id,int columns_count,ImGuiColumnsFlags flags)

{
  ImGuiContext *pIVar1;
  ImGuiWindow *str;
  ImGuiColumnsSet *pIVar2;
  ImGuiColumnData *pIVar3;
  ImGuiColumnsFlags in_EDX;
  int in_ESI;
  char *in_RDI;
  float fVar4;
  float fVar5;
  float fVar6;
  float clip_x2;
  float clip_x1;
  ImGuiColumnData *column_1;
  int n_1;
  ImGuiColumnData column;
  int n;
  float content_region_width;
  ImGuiColumnsSet *columns;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  float in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff64;
  undefined8 in_stack_ffffffffffffff70;
  int int_id;
  undefined4 in_stack_ffffffffffffff80;
  ImVec2 local_78;
  ImVec2 local_70;
  int local_58;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  ImGuiID in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar7;
  undefined4 in_stack_ffffffffffffffcc;
  
  pIVar1 = GImGui;
  int_id = (int)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  str = GetCurrentWindow();
  iVar7 = in_ESI;
  if ((ImVector<ImGuiColumnData> *)in_RDI != (ImVector<ImGuiColumnData> *)0x0) {
    iVar7 = 0;
  }
  PushID(int_id);
  if ((ImVector<ImGuiColumnData> *)in_RDI == (ImVector<ImGuiColumnData> *)0x0) {
    in_RDI = "columns";
  }
  ImGuiWindow::GetID((ImGuiWindow *)CONCAT44(iVar7,in_stack_ffffffffffffff80),(char *)str,in_RDI);
  PopID();
  pIVar2 = FindOrAddColumnsSet((ImGuiWindow *)
                               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                               in_stack_ffffffffffffffc4);
  pIVar2->Current = 0;
  pIVar2->Count = in_ESI;
  pIVar2->Flags = in_EDX;
  (str->DC).ColumnsSet = pIVar2;
  fVar4 = (str->SizeContentsExplicit).x;
  if ((fVar4 != 0.0) || (NAN(fVar4))) {
    fVar4 = (str->SizeContentsExplicit).x;
  }
  else {
    fVar4 = (str->InnerClipRect).Max.x - (str->Pos).x;
  }
  pIVar2->MinX = (str->DC).Indent.x - (pIVar1->Style).ItemSpacing.x;
  fVar5 = ImMax<float>(fVar4 - (str->Scroll).x,pIVar2->MinX + 1.0);
  pIVar2->MaxX = fVar5;
  pIVar2->StartPosY = (str->DC).CursorPos.y;
  pIVar2->StartMaxPosX = (str->DC).CursorMaxPos.x;
  fVar5 = (str->DC).CursorPos.y;
  pIVar2->LineMaxY = fVar5;
  pIVar2->LineMinY = fVar5;
  (str->DC).ColumnsOffset.x = 0.0;
  (str->DC).CursorPos.x =
       (float)(int)((str->Pos).x + (str->DC).Indent.x + (str->DC).ColumnsOffset.x);
  if (((pIVar2->Columns).Size != 0) && ((pIVar2->Columns).Size != in_ESI + 1)) {
    ImVector<ImGuiColumnData>::resize
              ((ImVector<ImGuiColumnData> *)
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff5c);
  }
  pIVar2->IsFirstFrame = (pIVar2->Columns).Size == 0;
  if ((pIVar2->Columns).Size == 0) {
    ImVector<ImGuiColumnData>::reserve((ImVector<ImGuiColumnData> *)in_RDI,(int)fVar4);
    for (iVar7 = 0; iVar7 < in_ESI + 1; iVar7 = iVar7 + 1) {
      ImGuiColumnData::ImGuiColumnData
                ((ImGuiColumnData *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      ImVector<ImGuiColumnData>::push_back
                ((ImVector<ImGuiColumnData> *)
                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 (ImGuiColumnData *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    }
  }
  for (local_58 = 0; local_58 < in_ESI; local_58 = local_58 + 1) {
    pIVar3 = ImVector<ImGuiColumnData>::operator[](&pIVar2->Columns,local_58);
    in_stack_ffffffffffffff64 = (str->Pos).x + 0.5;
    fVar5 = GetColumnOffset((int)((ulong)in_RDI >> 0x20));
    ImFloor((in_stack_ffffffffffffff64 + fVar5) - 1.0);
    fVar5 = (str->Pos).x + 0.5;
    fVar6 = GetColumnOffset((int)((ulong)in_RDI >> 0x20));
    ImFloor((fVar5 + fVar6) - 1.0);
    ImRect::ImRect((ImRect *)in_RDI,fVar4,fVar5,in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
    ;
    (pIVar3->ClipRect).Min = local_78;
    (pIVar3->ClipRect).Max = local_70;
    ImRect::ClipWith((ImRect *)in_RDI,(ImRect *)CONCAT44(fVar4,fVar5));
  }
  ImDrawList::ChannelsSplit
            ((ImDrawList *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffbc);
  iVar7 = (int)((ulong)in_RDI >> 0x20);
  PushColumnClipRect(iVar7);
  GetColumnWidth(iVar7);
  PushItemWidth(in_stack_ffffffffffffff64);
  return;
}

Assistant:

void ImGui::BeginColumns(const char* str_id, int columns_count, ImGuiColumnsFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    IM_ASSERT(columns_count > 1);
    IM_ASSERT(window->DC.ColumnsSet == NULL); // Nested columns are currently not supported

    // Differentiate column ID with an arbitrary prefix for cases where users name their columns set the same as another widget.
    // In addition, when an identifier isn't explicitly provided we include the number of columns in the hash to make it uniquer.
    PushID(0x11223347 + (str_id ? 0 : columns_count));
    ImGuiID id = window->GetID(str_id ? str_id : "columns");
    PopID();

    // Acquire storage for the columns set
    ImGuiColumnsSet* columns = FindOrAddColumnsSet(window, id);
    IM_ASSERT(columns->ID == id);
    columns->Current = 0;
    columns->Count = columns_count;
    columns->Flags = flags;
    window->DC.ColumnsSet = columns;

    // Set state for first column
    const float content_region_width = (window->SizeContentsExplicit.x != 0.0f) ? (window->SizeContentsExplicit.x) : (window->InnerClipRect.Max.x - window->Pos.x);
    columns->MinX = window->DC.Indent.x - g.Style.ItemSpacing.x; // Lock our horizontal range
    columns->MaxX = ImMax(content_region_width - window->Scroll.x, columns->MinX + 1.0f);
    columns->StartPosY = window->DC.CursorPos.y;
    columns->StartMaxPosX = window->DC.CursorMaxPos.x;
    columns->LineMinY = columns->LineMaxY = window->DC.CursorPos.y;
    window->DC.ColumnsOffset.x = 0.0f;
    window->DC.CursorPos.x = (float)(int)(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);

    // Clear data if columns count changed
    if (columns->Columns.Size != 0 && columns->Columns.Size != columns_count + 1)
        columns->Columns.resize(0);

    // Initialize defaults
    columns->IsFirstFrame = (columns->Columns.Size == 0);
    if (columns->Columns.Size == 0)
    {
        columns->Columns.reserve(columns_count + 1);
        for (int n = 0; n < columns_count + 1; n++)
        {
            ImGuiColumnData column;
            column.OffsetNorm = n / (float)columns_count;
            columns->Columns.push_back(column);
        }
    }

    for (int n = 0; n < columns_count; n++)
    {
        // Compute clipping rectangle
        ImGuiColumnData* column = &columns->Columns[n];
        float clip_x1 = ImFloor(0.5f + window->Pos.x + GetColumnOffset(n) - 1.0f);
        float clip_x2 = ImFloor(0.5f + window->Pos.x + GetColumnOffset(n + 1) - 1.0f);
        column->ClipRect = ImRect(clip_x1, -FLT_MAX, clip_x2, +FLT_MAX);
        column->ClipRect.ClipWith(window->ClipRect);
    }

    window->DrawList->ChannelsSplit(columns->Count);
    PushColumnClipRect();
    PushItemWidth(GetColumnWidth() * 0.65f);
}